

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  element_type *peVar1;
  _func_bool *function;
  _func_void *function_00;
  shared_ptr<MainLoop> local_60 [2];
  __1 local_39;
  shared_ptr<MainLoop> local_38;
  __0 local_21;
  __shared_ptr_access<MainLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false> local_20 [20];
  undefined4 local_c;
  
  local_c = 0;
  MainLoop::Get();
  peVar1 = std::__shared_ptr_access<MainLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (local_20);
  function = main::$_0::operator_cast_to_function_pointer(&local_21);
  MainLoop::SetRunCondition(peVar1,function);
  std::shared_ptr<MainLoop>::~shared_ptr((shared_ptr<MainLoop> *)local_20);
  MainLoop::Get();
  peVar1 = std::__shared_ptr_access<MainLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<MainLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_38);
  function_00 = main::$_1::operator_cast_to_function_pointer(&local_39);
  MainLoop::AddToDelayedUpdate(peVar1,function_00);
  std::shared_ptr<MainLoop>::~shared_ptr(&local_38);
  MainLoop::Get();
  peVar1 = std::__shared_ptr_access<MainLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<MainLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_60);
  MainLoop::Run(peVar1);
  std::shared_ptr<MainLoop>::~shared_ptr(local_60);
  return 0;
}

Assistant:

int main()
{
  static bool keepRunning = true;
  MainLoop::Get()->SetRunCondition([]() -> bool { return keepRunning; });
  MainLoop::Get()->AddToDelayedUpdate([]() {
    static int count = 0;
    count++;
    if (count > 10)
      keepRunning = false;
    std::cout << "update!\n"; 
    });
  MainLoop::Get()->Run();
  return 0;
}